

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

void * density::
       heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
       ::get_element(QueueControl *i_control)

{
  undefined8 *i_address;
  runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  *this;
  size_t i_alignment;
  void *local_18;
  void *result;
  QueueControl *i_control_local;
  
  i_address = (undefined8 *)address_add(i_control,0x10);
  if ((i_control->m_next & 4) == 0) {
    this = type_after_control(i_control);
    i_alignment = runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                  ::alignment(this);
    local_18 = address_upper_align(i_address,i_alignment);
  }
  else {
    local_18 = (void *)*i_address;
  }
  return local_18;
}

Assistant:

static void * get_element(detail::QueueControl * i_control) noexcept
        {
            auto result = address_add(i_control, s_sizeof_ControlBlock + s_sizeof_RuntimeType);
            if (i_control->m_next & detail::Queue_External)
            {
                result = static_cast<ExternalBlock *>(result)->m_element;
            }
            else
            {
                result = address_upper_align(result, type_after_control(i_control)->alignment());
            }
            return result;
        }